

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::php::Generator::Generate
          (Generator *this,FileDescriptor *file,Options *options,GeneratorContext *generator_context
          ,string *error)

{
  MethodDescriptor *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  undefined8 uVar3;
  string *full_name;
  StringPiece str;
  StringPiece prefix;
  size_type sVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  __type _Var8;
  int i_4;
  int iVar9;
  undefined4 extraout_var;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  FileDescriptorProto *pFVar14;
  Rep *pRVar15;
  FileDescriptor *pFVar16;
  ulong uVar17;
  undefined4 extraout_var_00;
  Descriptor *pDVar18;
  Options *pOVar19;
  void **ppvVar20;
  void **ppvVar21;
  bool is_descriptor;
  bool is_descriptor_00;
  bool is_descriptor_01;
  ServiceDescriptor *desc;
  long lVar22;
  int i;
  char *pcVar23;
  string *psVar24;
  size_type sVar25;
  int i_2;
  const_iterator cVar26;
  long lVar27;
  int i_1;
  long local_290;
  FileDescriptor *file_node;
  string files_data;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  pointer local_230;
  pointer pbStack_228;
  pointer local_220;
  GeneratorContext *local_218;
  _anonymous_namespace_ *local_210;
  map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
  deps;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  nodes_without_dependency;
  map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
  dependency_count;
  Printer printer;
  string dependency_filename;
  string fullname;
  FileDescriptorSet sorted_file_set;
  string filename;
  ZeroCopyOutputStream *pZVar10;
  
  bVar7 = options->is_descriptor;
  local_218 = generator_context;
  if ((bool)bVar7 == true) {
    bVar6 = std::operator!=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             file,&kDescriptorFile_abi_cxx11_);
    if (bVar6) goto LAB_002b2e15;
    bVar7 = options->is_descriptor;
  }
  if (((bVar7 & 1) != 0) || (file[0x3a] == (FileDescriptor)0x3)) {
    (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
              (&filename,(_anonymous_namespace_ *)file,(FileDescriptor *)options,
               (Options *)generator_context);
    iVar9 = (*local_218->_vptr_GeneratorContext[2])(local_218,&filename);
    pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar9);
    io::Printer::Printer(&printer,pZVar10,'^');
    anon_unknown_2::GenerateHead(file,&printer);
    anon_unknown_2::FilenameToClassname(&fullname,&filename);
    iVar9 = std::__cxx11::string::find_last_of((char *)&fullname,0x3cdbbf);
    if (iVar9 == -1) {
      pOVar19 = (Options *)&fullname;
      io::Printer::Print<char[5],std::__cxx11::string>
                (&printer,"class ^name^\n{\n",(char (*) [5])0x3de831,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar19);
    }
    else {
      std::__cxx11::string::substr((ulong)&files_data,(ulong)&fullname);
      io::Printer::Print<char[5],std::__cxx11::string>
                (&printer,"namespace ^name^;\n\n",(char (*) [5])0x3de831,&files_data);
      std::__cxx11::string::~string((string *)&files_data);
      std::__cxx11::string::substr((ulong)&files_data,(ulong)&fullname);
      pOVar19 = (Options *)&files_data;
      io::Printer::Print<char[5],std::__cxx11::string>
                (&printer,"class ^name^\n{\n",(char (*) [5])0x3de831,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar19);
      std::__cxx11::string::~string((string *)&files_data);
    }
    anon_unknown_2::Indent(&printer);
    io::Printer::Print<>
              (&printer,
               "public static $is_initialized = false;\n\npublic static function initOnce() {\n");
    anon_unknown_2::Indent(&printer);
    if (options->aggregate_metadata == true) {
      io::Printer::Print<>
                (&printer,
                 "$pool = \\Google\\Protobuf\\Internal\\DescriptorPool::getGeneratedPool();\nif (static::$is_initialized == true) {\n  return;\n}\n"
                );
      deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &deps._M_t._M_impl.super__Rb_tree_header._M_header;
      deps._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           deps._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      deps._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      dependency_count._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &dependency_count._M_t._M_impl.super__Rb_tree_header._M_header;
      dependency_count._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      dependency_count._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      dependency_count._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header;
      nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
           0xffffffff00000000;
      nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      deps._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      dependency_count._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           dependency_count._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      FileDescriptorSet::FileDescriptorSet(&sorted_file_set);
      pOVar19 = (Options *)&dependency_count;
      anon_unknown_2::AnalyzeDependencyForFile
                (file,&nodes_without_dependency,&deps,
                 (map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                  *)pOVar19);
      while( true ) {
        if (nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) break;
        file_node = *(FileDescriptor **)
                     (nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                     + 1);
        std::
        _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::erase((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)&nodes_without_dependency,&file_node);
        pmVar11 = std::
                  map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                  ::operator[](&deps,&file_node);
        for (p_Var13 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            pFVar16 = file_node,
            (_Rb_tree_header *)p_Var13 != &(pmVar11->_M_t)._M_impl.super__Rb_tree_header;
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
          uVar3 = *(undefined8 *)(p_Var13 + 1);
          files_data._M_dataplus._M_p._0_2_ = (undefined2)uVar3;
          files_data._M_dataplus._M_p._2_1_ = (undefined1)((ulong)uVar3 >> 0x10);
          files_data._M_dataplus._M_p._3_5_ = (undefined5)((ulong)uVar3 >> 0x18);
          pmVar12 = std::
                    map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                    ::operator[]((map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                                  *)&dependency_count._M_t,(key_type *)&files_data);
          if (*pmVar12 == 1) {
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
            ::erase(&dependency_count._M_t,(key_type *)&files_data);
            std::
            _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                      ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)&nodes_without_dependency,(FileDescriptor **)&files_data);
          }
          else {
            pmVar12 = std::
                      map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                      ::operator[]((map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                                    *)&dependency_count._M_t,(key_type *)&files_data);
            *pmVar12 = *pmVar12 + -1;
          }
        }
        if ((options->aggregate_metadata_prefixes)._M_t._M_impl.super__Rb_tree_header._M_node_count
            == 0) {
LAB_002b2ab1:
          pFVar14 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::Add
                              (&sorted_file_set.file_);
          FileDescriptor::CopyTo(file_node,pFVar14);
          pRVar15 = (pFVar14->dependency_).super_RepeatedPtrFieldBase.rep_;
          cVar26.it_ = pRVar15->elements;
          if (pRVar15 == (Rep *)0x0) {
            cVar26.it_ = (void **)0x0;
          }
          while( true ) {
            ppvVar20 = pRVar15->elements;
            if (pRVar15 == (Rep *)0x0) {
              ppvVar20 = (void **)0x0;
            }
            if (cVar26.it_ ==
                ppvVar20 + (pFVar14->dependency_).super_RepeatedPtrFieldBase.current_size_)
            goto LAB_002b2b21;
            bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)*cVar26.it_,&kDescriptorFile_abi_cxx11_);
            if (bVar6) break;
            cVar26.it_ = cVar26.it_ + 1;
            pRVar15 = (pFVar14->dependency_).super_RepeatedPtrFieldBase.rep_;
          }
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::erase(&pFVar14->dependency_,cVar26);
LAB_002b2b21:
          internal::RepeatedPtrFieldBase::
          Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                    (&(pFVar14->extension_).super_RepeatedPtrFieldBase);
          pRVar15 = (pFVar14->message_type_).super_RepeatedPtrFieldBase.rep_;
          ppvVar20 = pRVar15->elements;
          if (pRVar15 == (Rep *)0x0) {
            ppvVar20 = (void **)0x0;
          }
          while( true ) {
            pOVar19 = (Options *)pRVar15->elements;
            if (pRVar15 == (Rep *)0x0) {
              pOVar19 = (Options *)0x0;
            }
            if ((_Alloc_hider *)ppvVar20 ==
                (_Alloc_hider *)&pOVar19->is_descriptor +
                (pFVar14->message_type_).super_RepeatedPtrFieldBase.current_size_) break;
            internal::RepeatedPtrFieldBase::
            Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                      ((RepeatedPtrFieldBase *)((long)*ppvVar20 + 0x78));
            ppvVar20 = ppvVar20 + 1;
            pRVar15 = (pFVar14->message_type_).super_RepeatedPtrFieldBase.rep_;
          }
        }
        else {
          for (p_Var13 = (options->aggregate_metadata_prefixes)._M_t._M_impl.super__Rb_tree_header.
                         _M_header._M_left;
              (_Rb_tree_header *)p_Var13 !=
              &(options->aggregate_metadata_prefixes)._M_t._M_impl.super__Rb_tree_header;
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
            stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                      ((StringPiece *)&files_data,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pFVar16 + 8));
            stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                      ((StringPiece *)&dependency_filename,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var13 + 1));
            str.ptr_._2_1_ = files_data._M_dataplus._M_p._2_1_;
            str.ptr_._0_2_ = files_data._M_dataplus._M_p._0_2_;
            str.ptr_._3_5_ = files_data._M_dataplus._M_p._3_5_;
            str.length_ = files_data._M_string_length;
            prefix.length_ = dependency_filename._M_string_length;
            prefix.ptr_ = dependency_filename._M_dataplus._M_p;
            pOVar19 = (Options *)dependency_filename._M_string_length;
            bVar6 = HasPrefixString(str,prefix);
            if (bVar6) goto LAB_002b2ab1;
          }
          files_data._M_dataplus._M_p._2_1_ = 0;
          files_data.field_2._M_allocated_capacity =
               files_data.field_2._M_allocated_capacity & 0xffffffff00000000;
          files_data.field_2._8_8_ = 0;
          local_260._M_allocated_capacity = (size_type)&files_data.field_2;
          local_250._M_p = (pointer)0x0;
          files_data._M_dataplus._M_p._0_2_ = 0;
          local_260._8_8_ = local_260._M_allocated_capacity;
          (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                    (&dependency_filename,(_anonymous_namespace_ *)file_node,
                     (FileDescriptor *)&files_data,pOVar19);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&files_data._M_string_length);
          anon_unknown_2::FilenameToClassname(&files_data,&dependency_filename);
          pOVar19 = (Options *)&files_data;
          io::Printer::Print<char[5],std::__cxx11::string>
                    (&printer,"\\^name^::initOnce();\n",(char (*) [5])0x3de831,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &files_data);
          std::__cxx11::string::~string((string *)&files_data);
          std::__cxx11::string::~string((string *)&dependency_filename);
        }
      }
      paVar1 = &files_data.field_2;
      files_data._M_dataplus._M_p._0_2_ = SUB82(paVar1,0);
      files_data._M_dataplus._M_p._2_1_ = (undefined1)((ulong)paVar1 >> 0x10);
      files_data._M_dataplus._M_p._3_5_ = (undefined5)((ulong)paVar1 >> 0x18);
      files_data._M_string_length = 0;
      files_data.field_2._M_allocated_capacity =
           files_data.field_2._M_allocated_capacity & 0xffffffffffffff00;
      MessageLite::SerializeToString((MessageLite *)&sorted_file_set,&files_data);
      io::Printer::Print<>(&printer,"$pool->internalAddGeneratedFile(\n");
      anon_unknown_2::Indent(&printer);
      io::Printer::Print<>(&printer,"\'");
      sVar4 = files_data._M_string_length;
      lVar22 = CONCAT53(files_data._M_dataplus._M_p._3_5_,
                        CONCAT12(files_data._M_dataplus._M_p._2_1_,files_data._M_dataplus._M_p._0_2_
                                ));
      for (sVar25 = 0; sVar4 != sVar25; sVar25 = sVar25 + 1) {
        cVar2 = *(char *)(lVar22 + sVar25);
        pcVar23 = "\\\'";
        if (cVar2 == '\'') {
LAB_002b2d2f:
          io::Printer::Print<>(&printer,pcVar23);
        }
        else {
          if (cVar2 == '\\') {
            pcVar23 = "\\\\";
            goto LAB_002b2d2f;
          }
          dependency_filename._M_dataplus._M_p = (pointer)&dependency_filename.field_2;
          std::__cxx11::string::_M_construct((ulong)&dependency_filename,'\x01');
          io::Printer::Print<char[5],std::__cxx11::string>
                    (&printer,"^char^",(char (*) [5])"char",&dependency_filename);
          std::__cxx11::string::~string((string *)&dependency_filename);
        }
      }
      io::Printer::Print<>(&printer,"\'\n");
      anon_unknown_2::Outdent(&printer);
      io::Printer::Print<>(&printer,", true);\n");
      io::Printer::Print<>(&printer,"static::$is_initialized = true;\n");
      std::__cxx11::string::~string((string *)&files_data);
      FileDescriptorSet::~FileDescriptorSet(&sorted_file_set);
      std::
      _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::~_Rb_tree(&nodes_without_dependency._M_t);
      std::
      _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_int>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
      ::~_Rb_tree(&dependency_count._M_t);
      std::
      _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
      ::~_Rb_tree(&deps._M_t);
    }
    else {
      io::Printer::Print<>
                (&printer,
                 "$pool = \\Google\\Protobuf\\Internal\\DescriptorPool::getGeneratedPool();\n\nif (static::$is_initialized == true) {\n  return;\n}\n"
                );
      if (options->is_descriptor == false) {
        for (iVar9 = 0; iVar9 < *(int *)(file + 0x20); iVar9 = iVar9 + 1) {
          pFVar16 = FileDescriptor::dependency(file,iVar9);
          _Var8 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    **)pFVar16,&kDescriptorFile_abi_cxx11_);
          if (!_Var8) {
            pFVar16 = FileDescriptor::dependency(file,iVar9);
            (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                      (&files_data,(_anonymous_namespace_ *)pFVar16,(FileDescriptor *)options,
                       pOVar19);
            anon_unknown_2::FilenameToClassname((string *)&deps,&files_data);
            pOVar19 = (Options *)&deps;
            io::Printer::Print<char[5],std::__cxx11::string>
                      (&printer,"\\^name^::initOnce();\n",(char (*) [5])0x3de831,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps);
            std::__cxx11::string::~string((string *)&deps);
            std::__cxx11::string::~string((string *)&files_data);
          }
        }
        FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)&files_data);
        pFVar14 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::Add
                            ((RepeatedPtrField<google::protobuf::FileDescriptorProto> *)
                             &files_data.field_2);
        FileDescriptor::CopyTo(file,pFVar14);
        pRVar15 = (pFVar14->dependency_).super_RepeatedPtrFieldBase.rep_;
        cVar26.it_ = pRVar15->elements;
        if (pRVar15 == (Rep *)0x0) {
          cVar26.it_ = (void **)0x0;
        }
        while( true ) {
          ppvVar20 = pRVar15->elements;
          if (pRVar15 == (Rep *)0x0) {
            ppvVar20 = (void **)0x0;
          }
          if (cVar26.it_ ==
              ppvVar20 + (pFVar14->dependency_).super_RepeatedPtrFieldBase.current_size_)
          goto LAB_002b2f89;
          bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)*cVar26.it_,&kDescriptorFile_abi_cxx11_);
          if (bVar6) break;
          cVar26.it_ = cVar26.it_ + 1;
          pRVar15 = (pFVar14->dependency_).super_RepeatedPtrFieldBase.rep_;
        }
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::erase(&pFVar14->dependency_,cVar26);
LAB_002b2f89:
        internal::RepeatedPtrFieldBase::
        Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                  (&(pFVar14->extension_).super_RepeatedPtrFieldBase);
        pRVar15 = (pFVar14->message_type_).super_RepeatedPtrFieldBase.rep_;
        ppvVar20 = pRVar15->elements;
        if (pRVar15 == (Rep *)0x0) {
          ppvVar20 = (void **)0x0;
        }
        while( true ) {
          ppvVar21 = pRVar15->elements;
          if (pRVar15 == (Rep *)0x0) {
            ppvVar21 = (void **)0x0;
          }
          if (ppvVar20 ==
              ppvVar21 + (pFVar14->message_type_).super_RepeatedPtrFieldBase.current_size_) break;
          internal::RepeatedPtrFieldBase::
          Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                    ((RepeatedPtrFieldBase *)((long)*ppvVar20 + 0x78));
          ppvVar20 = ppvVar20 + 1;
          pRVar15 = (pFVar14->message_type_).super_RepeatedPtrFieldBase.rep_;
        }
        deps._M_t._M_impl._0_8_ = &deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        deps._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        deps._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             ((ulong)deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
             0xffffffffffffff00);
        MessageLite::SerializeToString((MessageLite *)&files_data,(string *)&deps);
        io::Printer::Print<>(&printer,"$pool->internalAddGeneratedFile(\n");
        anon_unknown_2::Indent(&printer);
        io::Printer::Print<>(&printer,"\'");
        uVar5 = deps._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        uVar3 = deps._M_t._M_impl._0_8_;
        for (lVar22 = 0; uVar5 != lVar22; lVar22 = lVar22 + 1) {
          pcVar23 = "\\\'";
          if (*(char *)(uVar3 + lVar22) == '\'') {
LAB_002b3076:
            io::Printer::Print<>(&printer,pcVar23);
          }
          else {
            if (*(char *)(uVar3 + lVar22) == '\\') {
              pcVar23 = "\\\\";
              goto LAB_002b3076;
            }
            dependency_count._M_t._M_impl._0_8_ =
                 &dependency_count._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            std::__cxx11::string::_M_construct((ulong)&dependency_count,'\x01');
            io::Printer::Print<char[5],std::__cxx11::string>
                      (&printer,"^char^",(char (*) [5])"char",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dependency_count);
            std::__cxx11::string::~string((string *)&dependency_count);
          }
        }
        io::Printer::Print<>(&printer,"\'\n");
        anon_unknown_2::Outdent(&printer);
        io::Printer::Print<>(&printer,", true);\n\n");
        std::__cxx11::string::~string((string *)&deps);
        FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)&files_data);
      }
      else {
        lVar27 = 0;
        for (lVar22 = 0; lVar22 < *(int *)(file + 0x2c); lVar22 = lVar22 + 1) {
          std::__cxx11::string::string((string *)&files_data,"",(allocator *)&deps);
          anon_unknown_2::GenerateMessageToPool
                    (&files_data,(Descriptor *)(*(long *)(file + 0x58) + lVar27),&printer);
          std::__cxx11::string::~string((string *)&files_data);
          lVar27 = lVar27 + 0x88;
        }
        lVar22 = 0;
        for (lVar27 = 0; lVar27 < *(int *)(file + 0x30); lVar27 = lVar27 + 1) {
          anon_unknown_2::GenerateEnumToPool
                    ((EnumDescriptor *)(*(long *)(file + 0x60) + lVar22),&printer);
          lVar22 = lVar22 + 0x48;
        }
        io::Printer::Print<>(&printer,"$pool->finish();\n");
      }
      io::Printer::Print<>(&printer,"static::$is_initialized = true;\n");
    }
    anon_unknown_2::Outdent(&printer);
    io::Printer::Print<>(&printer,"}\n");
    anon_unknown_2::Outdent(&printer);
    io::Printer::Print<>(&printer,"}\n\n");
    std::__cxx11::string::~string((string *)&fullname);
    io::Printer::~Printer(&printer);
    if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar10->_vptr_ZeroCopyOutputStream[1])();
    }
    std::__cxx11::string::~string((string *)&filename);
    lVar22 = 0;
    for (lVar27 = 0; lVar27 < *(int *)(file + 0x2c); lVar27 = lVar27 + 1) {
      anon_unknown_2::GenerateMessageFile
                (file,(Descriptor *)(*(long *)(file + 0x58) + lVar22),options,local_218);
      lVar22 = lVar22 + 0x88;
    }
    lVar22 = 0;
    for (lVar27 = 0; lVar27 < *(int *)(file + 0x30); lVar27 = lVar27 + 1) {
      anon_unknown_2::GenerateEnumFile
                (file,(EnumDescriptor *)(*(long *)(file + 0x60) + lVar22),options,local_218);
      lVar22 = lVar22 + 0x48;
    }
    if (*(char *)(*(long *)(file + 0x78) + 0x9e) != '\x01') {
      return true;
    }
    desc = (ServiceDescriptor *)0x0;
    do {
      if ((long)*(int *)(file + 0x34) <= (long)desc) {
        return true;
      }
      lVar22 = *(long *)(file + 0x68);
      local_210 = (_anonymous_namespace_ *)(lVar22 + (long)desc * 0x30);
      (anonymous_namespace)::GeneratedClassNameImpl_abi_cxx11_((string *)&printer,local_210,desc);
      lVar22 = *(long *)(lVar22 + 0x10 + (long)desc * 0x30);
      lVar27 = *(long *)(lVar22 + 0x78);
      if ((*(byte *)(lVar27 + 0x28) & 0x80) == 0) {
        full_name = *(string **)(lVar22 + 8);
        if (full_name->_M_string_length == 0) {
          std::__cxx11::string::string((string *)&files_data,"",(allocator *)&deps);
        }
        else {
          anon_unknown_2::PhpName(&files_data,full_name,options);
        }
      }
      else {
        psVar24 = (string *)(*(ulong *)(lVar27 + 0x80) & 0xfffffffffffffffe);
        if (*(long *)(psVar24 + 8) == 0) {
          std::__cxx11::string::string((string *)&files_data,"",(allocator *)&deps);
        }
        else {
          std::__cxx11::string::string((string *)&files_data,psVar24);
        }
      }
      if (files_data._M_string_length == 0) {
        if ((char **)printer._0_8_ == &printer.buffer_) {
          nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)printer._24_8_;
          nodes_without_dependency._M_t._M_impl._0_8_ =
               &nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        }
        else {
          nodes_without_dependency._M_t._M_impl._0_1_ = printer.variable_delimiter_;
          nodes_without_dependency._M_t._M_impl._1_7_ = printer._1_7_;
        }
        nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)CONCAT71(printer.buffer_._1_7_,printer.buffer_._0_1_);
        nodes_without_dependency._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             printer.output_;
        printer.output_ = (ZeroCopyOutputStream *)0x0;
        printer.buffer_._0_1_ = 0;
        printer._0_8_ = &printer.buffer_;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &files_data,"\\");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &nodes_without_dependency,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer
                      );
        std::__cxx11::string::~string((string *)&deps);
      }
      std::__cxx11::string::~string((string *)&files_data);
      std::__cxx11::string::~string((string *)&printer);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dependency_count,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &nodes_without_dependency,"Interface");
      std::__cxx11::string::~string((string *)&nodes_without_dependency);
      for (uVar17 = 0;
          uVar17 < CONCAT44(dependency_count._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                            dependency_count._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
          uVar17 = uVar17 + 1) {
        if (*(char *)(dependency_count._M_t._M_impl._0_8_ + uVar17) == '\\') {
          *(undefined1 *)(dependency_count._M_t._M_impl._0_8_ + uVar17) = 0x2f;
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &sorted_file_set,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dependency_count,".php");
      std::__cxx11::string::~string((string *)&dependency_count);
      iVar9 = (*local_218->_vptr_GeneratorContext[2])(local_218,&sorted_file_set);
      pZVar10 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar9);
      io::Printer::Printer(&printer,pZVar10,'^');
      anon_unknown_2::GenerateHead(file,&printer);
      anon_unknown_2::FilenameToClassname
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &dependency_count,(string *)&sorted_file_set);
      iVar9 = std::__cxx11::string::find_last_of((char *)&dependency_count,0x3cdbbf);
      if (*(long *)((*(ulong *)(*(long *)(file + 0x78) + 0x80) & 0xfffffffffffffffe) + 8) == 0) {
        if ((*(byte *)(*(long *)(file + 0x78) + 0x28) & 0x80) == 0) {
          if ((iVar9 != -1) || (*(long *)(*(long *)(file + 8) + 8) != 0)) goto LAB_002b34c7;
        }
        else if (iVar9 != -1) goto LAB_002b34c7;
      }
      else {
LAB_002b34c7:
        std::__cxx11::string::substr((ulong)&files_data,(ulong)&dependency_count);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (&printer,"namespace ^name^;\n\n",(char (*) [5])0x3de831,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&files_data)
        ;
        std::__cxx11::string::~string((string *)&files_data);
      }
      io::Printer::Print<>(&printer,"/**\n");
      files_data.field_2._M_allocated_capacity = (size_type)&local_260;
      files_data.field_2._8_8_ = 0;
      local_260._M_allocated_capacity = local_260._M_allocated_capacity & 0xffffffffffffff00;
      local_250._M_p = (pointer)&local_240;
      local_248 = 0;
      local_240._M_local_buf[0] = '\0';
      local_230 = (pointer)0x0;
      pbStack_228 = (pointer)0x0;
      local_220 = (pointer)0x0;
      bVar6 = ServiceDescriptor::GetSourceLocation
                        ((ServiceDescriptor *)local_210,(SourceLocation *)&files_data);
      if (bVar6) {
        anon_unknown_2::GenerateDocCommentBodyForLocation
                  (&printer,(SourceLocation *)&files_data,true,0);
      }
      SourceLocation::~SourceLocation((SourceLocation *)&files_data);
      anon_unknown_2::EscapePhpdoc(&files_data,(string *)(*(long *)(local_210 + 8) + 0x20));
      io::Printer::Print<char[9],std::__cxx11::string>
                (&printer," * Protobuf type <code>^fullname^</code>\n */\n",(char (*) [9])"fullname"
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&files_data);
      std::__cxx11::string::~string((string *)&files_data);
      if (iVar9 == -1) {
        io::Printer::Print<char[5],std::__cxx11::string>
                  (&printer,"interface ^name^\n{\n",(char (*) [5])0x3de831,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &dependency_count);
      }
      else {
        std::__cxx11::string::substr((ulong)&files_data,(ulong)&dependency_count);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (&printer,"interface ^name^\n{\n",(char (*) [5])0x3de831,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&files_data)
        ;
        std::__cxx11::string::~string((string *)&files_data);
      }
      anon_unknown_2::Indent(&printer);
      local_290 = 0;
      for (lVar22 = 0; lVar22 < *(int *)(local_210 + 0x28); lVar22 = lVar22 + 1) {
        lVar27 = *(long *)(local_210 + 0x20);
        io::Printer::Print<>(&printer,"/**\n");
        files_data.field_2._M_allocated_capacity = (size_type)&local_260;
        files_data.field_2._8_8_ = 0;
        this_00 = (MethodDescriptor *)(local_290 + lVar27);
        local_260._M_allocated_capacity = local_260._M_allocated_capacity & 0xffffffffffffff00;
        local_250._M_p = (pointer)&local_240;
        local_248 = 0;
        local_240._M_local_buf[0] = '\0';
        local_230 = (pointer)0x0;
        pbStack_228 = (pointer)0x0;
        local_220 = (pointer)0x0;
        bVar6 = MethodDescriptor::GetSourceLocation(this_00,(SourceLocation *)&files_data);
        if (bVar6) {
          anon_unknown_2::GenerateDocCommentBodyForLocation
                    (&printer,(SourceLocation *)&files_data,true,0);
        }
        SourceLocation::~SourceLocation((SourceLocation *)&files_data);
        anon_unknown_2::UnderscoresToCamelCase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps,
                   *(string **)(lVar27 + 8 + local_290),false);
        anon_unknown_2::EscapePhpdoc
                  (&files_data,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps);
        io::Printer::Print<char[12],std::__cxx11::string>
                  (&printer," * Method <code>^method_name^</code>\n *\n",(char (*) [12])0x41cb75,
                   &files_data);
        std::__cxx11::string::~string((string *)&files_data);
        std::__cxx11::string::~string((string *)&deps);
        pDVar18 = MethodDescriptor::input_type(this_00);
        anon_unknown_2::FullClassName<google::protobuf::Descriptor>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps,
                   pDVar18,is_descriptor);
        anon_unknown_2::EscapePhpdoc
                  (&files_data,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (&printer," * @param \\^input_type^ $request\n",(char (*) [11])0x42bd45,
                   &files_data);
        std::__cxx11::string::~string((string *)&files_data);
        std::__cxx11::string::~string((string *)&deps);
        pDVar18 = MethodDescriptor::output_type(this_00);
        anon_unknown_2::FullClassName<google::protobuf::Descriptor>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps,
                   pDVar18,is_descriptor_00);
        anon_unknown_2::EscapePhpdoc
                  (&files_data,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps);
        io::Printer::Print<char[12],std::__cxx11::string>
                  (&printer," * @return \\^return_type^\n */\n",(char (*) [12])"return_type",
                   &files_data);
        std::__cxx11::string::~string((string *)&files_data);
        std::__cxx11::string::~string((string *)&deps);
        anon_unknown_2::UnderscoresToCamelCase
                  (&files_data,*(string **)(lVar27 + 8 + local_290),false);
        pDVar18 = MethodDescriptor::input_type(this_00);
        anon_unknown_2::FullClassName<google::protobuf::Descriptor>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps,
                   pDVar18,is_descriptor_01);
        io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                  (&printer,"public function ^camel_name^(\\^request_name^ $request);\n\n",
                   (char (*) [11])"camel_name",&files_data,(char (*) [13])"request_name",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&deps);
        std::__cxx11::string::~string((string *)&deps);
        std::__cxx11::string::~string((string *)&files_data);
        local_290 = local_290 + 0x40;
      }
      anon_unknown_2::Outdent(&printer);
      io::Printer::Print<>(&printer,"}\n\n");
      std::__cxx11::string::~string((string *)&dependency_count);
      io::Printer::~Printer(&printer);
      if (pZVar10 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar10->_vptr_ZeroCopyOutputStream[1])();
      }
      std::__cxx11::string::~string((string *)&sorted_file_set);
      desc = desc + 1;
    } while( true );
  }
LAB_002b2e15:
  std::__cxx11::string::assign((char *)error);
  return false;
}

Assistant:

bool Generator::Generate(const FileDescriptor* file, const Options& options,
                         GeneratorContext* generator_context,
                         std::string* error) const {
  if (options.is_descriptor && file->name() != kDescriptorFile) {
    *error =
        "Can only generate PHP code for google/protobuf/descriptor.proto.\n";
    return false;
  }

  if (!options.is_descriptor && file->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    *error =
        "Can only generate PHP code for proto3 .proto files.\n"
        "Please add 'syntax = \"proto3\";' to the top of your .proto file.\n";
    return false;
  }

  GenerateFile(file, options, generator_context);

  return true;
}